

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fragment.cpp
# Opt level: O1

error_code __thiscall
pstore::exchange::import_ns::fragment_sections::end_object(fragment_sections *this)

{
  size_t *psVar1;
  context *pcVar2;
  transaction_base *transaction;
  pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
  first;
  pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
  last;
  uint128 *puVar3;
  uint uVar4;
  __normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  _Var5;
  address_patch *this_00;
  _List_node_base *p_Var6;
  long lVar8;
  __normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  _Var9;
  error_code eVar10;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  fragment_index;
  extent<pstore::repo::fragment> fext;
  hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
  *local_168;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_160;
  extent<pstore::repo::fragment> local_158;
  undefined1 local_148 [24];
  unsigned_long auStack_130 [1];
  pair<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>::iterator_base<false>,_bool>
  local_128;
  error_category *peVar7;
  
  pcVar2 = (this->super_rule).context_.ptr_;
  transaction = (this->transaction_).ptr_;
  if ((pcVar2->db).ptr_ != transaction->db_) {
    assert_failed("ctxt->db == &transaction_->db ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/import_fragment.cpp"
                  ,0xa5);
  }
  first.it_._M_current =
       (__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
        )(this->dispatchers_).
         super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  last.it_._M_current =
       (__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
        )(this->dispatchers_).
         super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  local_158 = repo::fragment::
              alloc<pstore::transaction_base,pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>*,std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>>
                        (transaction,first,last);
  repo::fragment::load((fragment *)local_148,(pcVar2->db).ptr_,&local_158);
  eVar10 = check_fragment((fragment *)local_148._0_8_);
  peVar7 = eVar10._M_cat;
  uVar4 = eVar10._M_value;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
  }
  if (uVar4 != 0) goto LAB_00120542;
  index::
  get_index<(pstore::trailer::indices)2,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
            ((index *)&local_168,(pcVar2->db).ptr_,true);
  puVar3 = (this->digest_).ptr_;
  local_148._0_8_ = *(undefined8 *)&puVar3->v_;
  local_148._8_8_ = *(uint64_t *)((long)&puVar3->v_ + 8);
  local_148._16_8_ = local_158.addr.a_.a_;
  auStack_130[0] = local_158.size;
  index::
  hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
  ::insert_or_upsert<std::pair<pstore::uint128,pstore::extent<pstore::repo::fragment>>>
            (&local_128,local_168,(this->transaction_).ptr_,
             (pair<pstore::uint128,_pstore::extent<pstore::repo::fragment>_> *)local_148,false);
  if ((__uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
       )local_128.first.pos_._M_t.
        super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
        .
        super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
       )0x0) {
    operator_delete((void *)local_128.first.pos_._M_t.
                            super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
                            .
                            super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_*,_false>
                            ._M_head_impl,0x20);
  }
  local_128.first.pos_._M_t.
  super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
  .
  super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
          )0x0;
  lVar8 = (long)last.it_._M_current - (long)first.it_._M_current >> 5;
  _Var9._M_current =
       (unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
        *)first.it_._M_current;
  if (0 < lVar8) {
    _Var9._M_current =
         (unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
          *)((long)first.it_._M_current +
            ((long)last.it_._M_current - (long)first.it_._M_current & 0xffffffffffffffe0U));
    lVar8 = lVar8 + 1;
    _Var5._M_current =
         (unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
          *)((long)first.it_._M_current + 0x10);
    do {
      if ((_Var5._M_current[-2]._M_t.
           super___uniq_ptr_impl<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
           .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl)
          ->kind_ == linked_definitions) {
        _Var5._M_current = _Var5._M_current + -2;
        goto LAB_001204e5;
      }
      if ((_Var5._M_current[-1]._M_t.
           super___uniq_ptr_impl<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
           .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl)
          ->kind_ == linked_definitions) {
        _Var5._M_current = _Var5._M_current + -1;
        goto LAB_001204e5;
      }
      if ((((_Var5._M_current)->_M_t).
           super___uniq_ptr_impl<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
           .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl)
          ->kind_ == linked_definitions) goto LAB_001204e5;
      if ((_Var5._M_current[1]._M_t.
           super___uniq_ptr_impl<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
           .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl)
          ->kind_ == linked_definitions) {
        _Var5._M_current = _Var5._M_current + 1;
        goto LAB_001204e5;
      }
      lVar8 = lVar8 + -1;
      _Var5._M_current = _Var5._M_current + 4;
    } while (1 < lVar8);
  }
  lVar8 = (long)last.it_._M_current - (long)_Var9._M_current >> 3;
  if (lVar8 == 1) {
LAB_001204c5:
    _Var5._M_current = _Var9._M_current;
    if ((((_Var9._M_current)->_M_t).
         super___uniq_ptr_impl<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
         ._M_t.
         super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
         .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl)->
        kind_ != linked_definitions) {
      _Var5._M_current =
           (unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
            *)last.it_._M_current;
    }
  }
  else if (lVar8 == 2) {
LAB_001204b8:
    _Var5._M_current = _Var9._M_current;
    if ((((_Var9._M_current)->_M_t).
         super___uniq_ptr_impl<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
         ._M_t.
         super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
         .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl)->
        kind_ != linked_definitions) {
      _Var9._M_current = _Var9._M_current + 1;
      goto LAB_001204c5;
    }
  }
  else {
    _Var5._M_current =
         (unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
          *)last.it_._M_current;
    if ((lVar8 == 3) &&
       (_Var5._M_current = _Var9._M_current,
       (((_Var9._M_current)->_M_t).
        super___uniq_ptr_impl<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
        ._M_t.
        super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
        .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl)->
       kind_ != linked_definitions)) {
      _Var9._M_current = _Var9._M_current + 1;
      goto LAB_001204b8;
    }
  }
LAB_001204e5:
  if ((__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
       )_Var5._M_current != last.it_._M_current) {
    this_00 = (address_patch *)operator_new(0x20);
    address_patch::address_patch(this_00,(pcVar2->db).ptr_,&local_158);
    p_Var6 = (_List_node_base *)operator_new(0x18);
    p_Var6[1]._M_next = (_List_node_base *)this_00;
    std::__detail::_List_node_base::_M_hook(p_Var6);
    psVar1 = &(pcVar2->patches).
              super__List_base<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  eVar10 = rule::pop(&this->super_rule);
  peVar7 = eVar10._M_cat;
  uVar4 = eVar10._M_value;
  if (local_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160);
  }
LAB_00120542:
  eVar10._4_4_ = 0;
  eVar10._M_value = uVar4;
  eVar10._M_cat = peVar7;
  return eVar10;
}

Assistant:

std::error_code fragment_sections::end_object () {
                context * const ctxt = this->get_context ();
                PSTORE_ASSERT (ctxt->db == &transaction_->db ());

                auto const dispatchers_begin = make_pointee_adaptor (dispatchers_.begin ());
                auto const dispatchers_end = make_pointee_adaptor (dispatchers_.end ());
                auto const fext =
                    repo::fragment::alloc (*transaction_, dispatchers_begin, dispatchers_end);

                // Check that the fragment is legal before we go further.
                if (std::error_code const error =
                        this->check_fragment (*repo::fragment::load (*ctxt->db, fext))) {
                    return error;
                }
                auto const fragment_index =
                    index::get_index<trailer::indices::fragment> (*ctxt->db, true /* create */);
                fragment_index->insert (*transaction_, std::make_pair (*digest_, fext));

                // If this fragment has a linked-definitions section then we need to patch the
                // addresses of the referenced definitions one we've imported everything.
                if (std::find_if (dispatchers_begin, dispatchers_end,
                                  [] (repo::section_creation_dispatcher const & d) {
                                      return d.kind () == repo::section_kind::linked_definitions;
                                  }) != dispatchers_end) {
                    ctxt->patches.emplace_back (new address_patch (ctxt->db, fext));
                }
                return pop ();
            }